

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *str,string *whitespace)

{
  size_type strRange;
  size_type strEnd;
  allocator<char> local_29;
  long local_28;
  size_type strBegin;
  string *whitespace_local;
  string *str_local;
  
  strBegin = (size_type)whitespace;
  whitespace_local = str;
  str_local = __return_storage_ptr__;
  local_28 = std::__cxx11::string::find_first_not_of((string *)str,(ulong)whitespace);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::__cxx11::string::find_last_not_of((string *)whitespace_local,strBegin);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)whitespace_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string& str, const std::string& whitespace) {
  const auto strBegin = str.find_first_not_of(whitespace);
  if (strBegin == std::string::npos)
    return "";  // no content

  const auto strEnd = str.find_last_not_of(whitespace);
  const auto strRange = strEnd - strBegin + 1;

  return str.substr(strBegin, strRange);
}